

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

BaseType pls_format_to_basetype(PlsFormat format)

{
  PlsFormat format_local;
  
  if (5 < format - PlsR11FG11FB10F) {
    if (format - PlsRGBA8I < 2) {
      return Int;
    }
    if (format - PlsRGB10A2UI < 4) {
      return UInt;
    }
  }
  return Float;
}

Assistant:

static SPIRType::BaseType pls_format_to_basetype(PlsFormat format)
{
	switch (format)
	{
	default:
	case PlsR11FG11FB10F:
	case PlsR32F:
	case PlsRG16F:
	case PlsRGB10A2:
	case PlsRGBA8:
	case PlsRG16:
		return SPIRType::Float;

	case PlsRGBA8I:
	case PlsRG16I:
		return SPIRType::Int;

	case PlsRGB10A2UI:
	case PlsRGBA8UI:
	case PlsRG16UI:
	case PlsR32UI:
		return SPIRType::UInt;
	}
}